

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxmlc.c
# Opt level: O2

int split_left_right(SXML_CHAR *str,SXML_CHAR sep,int *l0,int *l1,int *i_sep,int *r0,int *r1,
                    int ignore_spaces,int ignore_quotes)

{
  byte bVar1;
  ushort **ppuVar2;
  ulong uVar3;
  SXML_CHAR *pSVar4;
  char *pcVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  byte *pbVar9;
  uint uVar10;
  char cVar11;
  byte bVar12;
  ulong uVar13;
  int iVar14;
  int iVar15;
  ulong uVar16;
  
  iVar15 = 0;
  if (str != (SXML_CHAR *)0x0) {
    if (i_sep != (int *)0x0) {
      *i_sep = -1;
    }
    if (ignore_spaces == 0) {
      uVar8 = 0xffffffffffffffff;
      pSVar4 = str;
      do {
        cVar11 = *pSVar4;
        uVar10 = (int)uVar8 + 1;
        uVar8 = (ulong)uVar10;
        uVar16 = 0;
        iVar15 = 0;
        ignore_quotes = 0;
        uVar3 = uVar8;
        if (cVar11 == '\0') goto LAB_00105d2b;
        pSVar4 = pSVar4 + 1;
        bVar12 = 0;
        uVar6 = uVar10;
      } while (cVar11 != sep);
    }
    else {
      uVar16 = 0;
      while( true ) {
        bVar12 = str[uVar16];
        uVar13 = (ulong)(char)bVar12;
        if (((long)uVar13 < 1) ||
           (ppuVar2 = __ctype_b_loc(), (*(byte *)((long)*ppuVar2 + uVar13 * 2 + 1) & 0x20) == 0))
        break;
        uVar16 = uVar16 + 1;
      }
      uVar3 = uVar16;
      if ((ignore_quotes == 0) || ((bVar12 != 0x27 && (bVar12 != 0x22)))) {
        while ((cVar11 = (char)uVar13, uVar8 = uVar3, cVar11 != '\0' &&
               ((cVar11 != sep &&
                ((cVar11 < '\0' ||
                 (ppuVar2 = __ctype_b_loc(),
                 (*(byte *)((long)*ppuVar2 + (long)cVar11 * 2 + 1) & 0x20) == 0))))))) {
          uVar13 = (ulong)(byte)str[uVar3 + 1];
          uVar3 = uVar3 + 1;
        }
        while (('\0' < (char)uVar13 &&
               (ppuVar2 = __ctype_b_loc(),
               (*(byte *)((long)*ppuVar2 + (uVar13 & 0xff) * 2 + 1) & 0x20) != 0))) {
          uVar13 = (ulong)(byte)str[uVar8 + 1];
          uVar8 = uVar8 + 1;
        }
LAB_00105d2b:
        uVar10 = (uint)uVar3;
        iVar15 = (int)uVar16;
        bVar12 = 0;
        uVar6 = (uint)uVar8;
      }
      else {
        iVar15 = (int)(uVar16 + 1);
        uVar8 = uVar16 + 1 & 0xffffffff;
        while( true ) {
          iVar14 = (int)uVar8;
          uVar3 = (ulong)iVar14;
          bVar1 = str[uVar3];
          if (((bVar1 == 0) || (bVar1 == bVar12)) ||
             ((bVar1 == 0x5c &&
              (uVar8 = (long)iVar14 + 1, uVar3 = uVar8, str[(long)iVar14 + 1] == '\0')))) break;
          uVar8 = (ulong)((int)uVar8 + 1);
        }
        do {
          uVar16 = uVar3;
          uVar10 = (uint)uVar8;
          cVar11 = str[uVar16 + 1];
          if ((long)cVar11 < 1) break;
          ppuVar2 = __ctype_b_loc();
          uVar3 = uVar16 + 1;
        } while ((*(byte *)((long)*ppuVar2 + (long)cVar11 * 2 + 1) & 0x20) != 0);
        uVar6 = (int)uVar16 + 1;
      }
    }
    if (l0 != (int *)0x0) {
      *l0 = iVar15;
    }
    if (l1 != (int *)0x0) {
      *l1 = uVar10 - 1;
    }
    if (i_sep != (int *)0x0) {
      *i_sep = uVar6;
    }
    lVar7 = (long)(int)uVar6;
    if ((str[lVar7] == '\0') || (bVar1 = str[lVar7 + 1], bVar1 == 0)) {
      if (r0 != (int *)0x0) {
        *r0 = uVar6;
      }
      if (r1 != (int *)0x0) {
        *r1 = uVar6 - 1;
      }
      iVar15 = 1;
      if (i_sep != (int *)0x0) {
        *i_sep = -(uint)(str[lVar7] == '\0') | uVar6;
      }
    }
    else {
      uVar8 = lVar7 + 1;
      if (ignore_spaces != 0) {
        pbVar9 = (byte *)(str + uVar8);
        while( true ) {
          pbVar9 = pbVar9 + 1;
          if (((char)bVar1 < '\x01') ||
             (ppuVar2 = __ctype_b_loc(),
             (*(byte *)((long)*ppuVar2 + (ulong)bVar1 * 2 + 1) & 0x20) == 0)) break;
          bVar1 = *pbVar9;
          uVar8 = (ulong)((int)uVar8 + 1);
        }
        if ((ignore_quotes != 0) && ((bVar1 == 0x22 || (bVar1 == 0x27)))) {
          bVar12 = bVar1;
        }
      }
      uVar6 = (int)uVar8 + 1;
      uVar10 = uVar6;
      while( true ) {
        uVar8 = (ulong)uVar10;
        lVar7 = (long)(int)uVar10;
        bVar1 = str[lVar7];
        if (bVar1 == 0) break;
        if ((ignore_quotes != 0) && (bVar1 == bVar12)) goto LAB_00105e33;
        if (bVar1 == 0x5c) {
          uVar8 = lVar7 + 1;
          uVar10 = (uint)uVar8;
          if (str[lVar7 + 1] == '\0') break;
        }
        uVar10 = uVar10 + 1;
      }
      uVar10 = (uint)uVar8;
      if (ignore_quotes != 0) {
        if (bVar12 != 0) {
          return 0;
        }
LAB_00105e33:
        uVar8 = (ulong)(uVar10 - 1);
      }
      uVar10 = (uint)uVar8;
      if (ignore_spaces == 0) {
        pcVar5 = str + (int)uVar10;
        do {
          pcVar5 = pcVar5 + 1;
          uVar10 = (int)uVar8 + 1;
          uVar8 = (ulong)uVar10;
        } while (*pcVar5 != '\0');
      }
      if (r0 != (int *)0x0) {
        *r0 = uVar6;
      }
      iVar15 = 1;
      if (r1 != (int *)0x0) {
        *r1 = uVar10;
      }
    }
  }
  return iVar15;
}

Assistant:

int split_left_right(SXML_CHAR* str, SXML_CHAR sep, int* l0, int* l1, int* i_sep, int* r0, int* r1, int ignore_spaces, int ignore_quotes)
{
	int n0, n1, is;
	SXML_CHAR quote = '\0';

	if (str == NULL)
		return FALSE;

	if (i_sep != NULL)
		*i_sep = -1;

	if (!ignore_spaces) /* No sense of ignore quotes if spaces are to be kept */
		ignore_quotes = FALSE;

	/* Parse left part */

	if (ignore_spaces) {
		for (n0 = 0; str[n0] != NULC && sx_isspace(str[n0]); n0++) ; /* Skip head spaces, n0 points to first non-space */
		if (ignore_quotes && isquote(str[n0])) { /* If quote is found, look for next one */
			quote = str[n0++]; /* Quote can be '\'' or '"' */
			for (n1 = n0; str[n1] != NULC && str[n1] != quote; n1++) {
				if (str[n1] == C2SX('\\') && str[++n1] == NULC)
					break; /* Escape character (can be the last) */
			}
			for (is = n1 + 1; str[is] != NULC && sx_isspace(str[is]); is++) ; /* '--' not to take quote into account */
		} else {
			for (n1 = n0; str[n1] != NULC && str[n1] != sep && !sx_isspace(str[n1]); n1++) ; /* Search for separator or a space */
			for (is = n1; str[is] != NULC && sx_isspace(str[is]); is++) ;
		}
	} else {
		n0 = 0;
		for (n1 = 0; str[n1] != NULC && str[n1] != sep; n1++) ; /* Search for separator only */
		is = n1;
	}

	/* Here 'n0' is the start of left member, 'n1' is the character after the end of left member */

	if (l0 != NULL)
		*l0 = n0;
	if (l1 != NULL)
		*l1 = n1 - 1;
	if (i_sep != NULL)
		*i_sep = is;
	if (str[is] == NULC || str[is+1] == NULC) { /* No separator => empty right member */
		if (r0 != NULL)
			*r0 = is;
		if (r1 != NULL)
			*r1 = is-1;
		if (i_sep != NULL)
			*i_sep = (str[is] == NULC ? -1 : is);
		return TRUE;
	}

	/* Parse right part */

	n0 = is + 1;
	if (ignore_spaces) {
		for (; str[n0] != NULC && sx_isspace(str[n0]); n0++) ;
		if (ignore_quotes && isquote(str[n0]))
			quote = str[n0];
	}

	for (n1 = ++n0; str[n1]; n1++) {
		if (ignore_quotes && str[n1] == quote) /* Quote was reached */
			break;
		if (str[n1] == C2SX('\\') && str[++n1] == NULC) /* Escape character (can be the last) */
			break;
	}
	if (ignore_quotes && str[n1--] != quote) /* Quote is not the same than earlier, '--' is not to take it into account */
		return FALSE;
	if (!ignore_spaces)
		while (str[++n1]) ; /* Jump down the end of the string */

	if (r0 != NULL)
		*r0 = n0;
	if (r1 != NULL)
		*r1 = n1;

	return TRUE;
}